

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdRankineIdxbufFormat::~MthdRankineIdxbufFormat(MthdRankineIdxbufFormat *this)

{
  MthdRankineIdxbufFormat *this_local;
  
  pgraph::SingleMthdTest::~SingleMthdTest(&this->super_SingleMthdTest);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0x11;
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
			}
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
			}
		}
		adjust_orig_bundle(&orig);
	}